

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionWorld.cpp
# Opt level: O0

void __thiscall
btCollisionWorld::contactPairTest
          (btCollisionWorld *this,btCollisionObject *colObjA,btCollisionObject *colObjB,
          ContactResultCallback *resultCallback)

{
  int iVar1;
  btCollisionShape *pbVar2;
  btTransform *pbVar3;
  btDispatcher *pbVar4;
  undefined4 extraout_var;
  btDispatcherInfo *pbVar5;
  btCollisionObject *in_RDX;
  btCollisionObject *in_RSI;
  btCollisionWorld *in_RDI;
  btBridgedManifoldResult contactPointResult;
  btCollisionAlgorithm *algorithm;
  btCollisionObjectWrapper obB;
  btCollisionObjectWrapper obA;
  undefined4 uVar6;
  undefined4 in_stack_fffffffffffffefc;
  btCollisionObjectWrapper *in_stack_ffffffffffffff00;
  btCollisionObjectWrapper *in_stack_ffffffffffffff08;
  long *plVar7;
  btBridgedManifoldResult *in_stack_ffffffffffffff10;
  undefined1 local_b0 [56];
  long *local_78;
  btCollisionObjectWrapper local_70;
  btCollisionObjectWrapper local_48;
  btCollisionObject *local_18;
  btCollisionObject *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  pbVar2 = btCollisionObject::getCollisionShape(in_RSI);
  pbVar3 = btCollisionObject::getWorldTransform(local_10);
  btCollisionObjectWrapper::btCollisionObjectWrapper
            (&local_48,(btCollisionObjectWrapper *)0x0,pbVar2,local_10,pbVar3,-1,-1);
  pbVar2 = btCollisionObject::getCollisionShape(local_18);
  pbVar3 = btCollisionObject::getWorldTransform(local_18);
  uVar6 = 0xffffffff;
  btCollisionObjectWrapper::btCollisionObjectWrapper
            (&local_70,(btCollisionObjectWrapper *)0x0,pbVar2,local_18,pbVar3,-1,-1);
  pbVar4 = getDispatcher(in_RDI);
  iVar1 = (*pbVar4->_vptr_btDispatcher[2])(pbVar4,&local_48,&local_70,0);
  local_78 = (long *)CONCAT44(extraout_var,iVar1);
  if (local_78 != (long *)0x0) {
    btBridgedManifoldResult::btBridgedManifoldResult
              (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
               (ContactResultCallback *)CONCAT44(in_stack_fffffffffffffefc,uVar6));
    plVar7 = local_78;
    pbVar5 = getDispatchInfo(in_RDI);
    (**(code **)(*plVar7 + 0x10))(plVar7,&local_48,&local_70,pbVar5,local_b0);
    (**(code **)*local_78)();
    pbVar4 = getDispatcher(in_RDI);
    (*pbVar4->_vptr_btDispatcher[0xf])(pbVar4,local_78);
    btBridgedManifoldResult::~btBridgedManifoldResult((btBridgedManifoldResult *)0x17cf2b);
  }
  return;
}

Assistant:

void	btCollisionWorld::contactPairTest(btCollisionObject* colObjA, btCollisionObject* colObjB, ContactResultCallback& resultCallback)
{
	btCollisionObjectWrapper obA(0,colObjA->getCollisionShape(),colObjA,colObjA->getWorldTransform(),-1,-1);
	btCollisionObjectWrapper obB(0,colObjB->getCollisionShape(),colObjB,colObjB->getWorldTransform(),-1,-1);

	btCollisionAlgorithm* algorithm = getDispatcher()->findAlgorithm(&obA,&obB);
	if (algorithm)
	{
		btBridgedManifoldResult contactPointResult(&obA,&obB, resultCallback);
		//discrete collision detection query
		algorithm->processCollision(&obA,&obB, getDispatchInfo(),&contactPointResult);

		algorithm->~btCollisionAlgorithm();
		getDispatcher()->freeCollisionAlgorithm(algorithm);
	}

}